

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O1

Pixmap __thiscall
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image
          (Am_Image_Array_Data *this,Am_Drawonable_Impl *draw,XColor **cols,int *n_cols)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  Am_RGB_Value *pAVar5;
  Am_Generic_Image *pAVar6;
  Screen_Desc *pSVar7;
  undefined8 uVar8;
  XColor *pXVar9;
  void *pvVar10;
  undefined4 *puVar11;
  Pixmap PVar12;
  long lVar13;
  uchar *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  unsigned_short *puVar20;
  ulong uVar21;
  ulong uVar22;
  
  pAVar5 = this->image_->color_map;
  iVar4 = (this->image_->iminfo).num_colors;
  *n_cols = iVar4;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (long)iVar4) {
    uVar15 = (long)iVar4 << 4;
  }
  pXVar9 = (XColor *)operator_new__(uVar15);
  *cols = pXVar9;
  if (0 < *n_cols) {
    puVar20 = &pAVar5->blue;
    lVar13 = 0;
    lVar17 = 0;
    do {
      pXVar9 = *cols;
      *(unsigned_short *)((long)&pXVar9->red + lVar13) = ((Am_RGB_Value *)(puVar20 + -2))->red << 8;
      *(unsigned_short *)((long)&pXVar9->green + lVar13) = puVar20[-1] << 8;
      *(unsigned_short *)((long)&pXVar9->blue + lVar13) = *puVar20 << 8;
      Am_Drawonable_Impl::Allocate_Closest_Color(draw,(XColor *)((long)&pXVar9->pixel + lVar13));
      lVar17 = lVar17 + 1;
      lVar13 = lVar13 + 0x10;
      puVar20 = puVar20 + 3;
    } while (lVar17 < *n_cols);
  }
  pAVar6 = this->image_;
  uVar2 = (pAVar6->iminfo).width;
  uVar21 = (ulong)uVar2;
  uVar3 = (pAVar6->iminfo).height;
  uVar15 = (ulong)uVar3;
  puVar14 = pAVar6->imdata;
  pSVar7 = draw->screen;
  iVar4 = pSVar7->depth;
  uVar8 = *(undefined8 *)
           (*(long *)(pSVar7->display + 0xe8) + 0x40 + (long)pSVar7->screen_number * 0x80);
  uVar18 = (uint)uVar2;
  if (iVar4 == 1) {
    uVar18 = uVar2 + 7 >> 3;
    pvVar10 = malloc((ulong)(uVar18 * uVar3));
    if (uVar15 != 0) {
      pXVar9 = *cols;
      uVar16 = 0;
      do {
        if (uVar21 != 0) {
          uVar22 = 0;
          do {
            if (pXVar9[puVar14[uVar22]].pixel == 0) {
              pbVar1 = (byte *)((long)pvVar10 + (uVar22 >> 3 & 0x1fffffff) + uVar16 * uVar18);
              *pbVar1 = *pbVar1 & ~Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar22 & 7];
            }
            else {
              pbVar1 = (byte *)((long)pvVar10 + (uVar22 >> 3 & 0x1fffffff) + uVar16 * uVar18);
              *pbVar1 = *pbVar1 | Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar22 & 7];
            }
            uVar22 = uVar22 + 1;
          } while (uVar21 != uVar22);
        }
        uVar16 = uVar16 + 1;
        puVar14 = puVar14 + uVar21;
      } while (uVar16 != uVar15);
    }
  }
  else if (iVar4 < 9) {
    pvVar10 = malloc(uVar15 * uVar21);
    if (uVar3 * uVar18 != 0) {
      pXVar9 = *cols;
      uVar16 = 0;
      do {
        *(char *)((long)pvVar10 + uVar16) = (char)pXVar9[puVar14[uVar16]].pixel;
        uVar16 = uVar16 + 1;
      } while (uVar3 * uVar18 != uVar16);
    }
  }
  else {
    uVar19 = uVar3 * uVar18;
    if (iVar4 < 0x11) {
      pvVar10 = malloc((ulong)(uVar3 * uVar18 * 2));
      if (uVar19 != 0) {
        pXVar9 = *cols;
        uVar16 = 0;
        do {
          *(short *)((long)pvVar10 + uVar16 * 2) = (short)pXVar9[puVar14[uVar16]].pixel;
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
      }
    }
    else {
      pvVar10 = malloc((ulong)(uVar3 * uVar18 * 4));
      if (uVar19 != 0) {
        pXVar9 = *cols;
        uVar16 = 0;
        do {
          *(int *)((long)pvVar10 + uVar16 * 4) = (int)pXVar9[puVar14[uVar16]].pixel;
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
      }
    }
  }
  puVar11 = (undefined4 *)XCreateImage(pSVar7->display,uVar8,iVar4,2,0,pvVar10,uVar21,uVar15,8,0);
  PVar12 = XCreatePixmap(draw->screen->display,draw->xlib_drawable,*puVar11,puVar11[1],puVar11[10]);
  Am_Drawonable_Impl::set_gc_using_fill(draw,&Am_No_Style,Am_DRAW_COPY,0);
  XSetClipMask(draw->screen->display,draw->screen->gc,0);
  XPutImage(draw->screen->display,PVar12,draw->screen->gc,puVar11,0,0,0,0,*puVar11,puVar11[1]);
  (*(draw->super_Am_Drawonable)._vptr_Am_Drawonable[0x1e])(draw,draw->screen->clip_region);
  (**(code **)(puVar11 + 0x18))(puVar11);
  return PVar12;
}

Assistant:

Pixmap
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image(
    const Am_Drawonable_Impl *draw, XColor *&cols, int &n_cols)
{
  // Make a copy of the image data, and adjust colors in the image
  // to the ones we have in the X colormap.
  Am_RGB_Value *ctbl;
  n_cols = image_->Get_Color_Map(ctbl);
  cols = new XColor[n_cols];

  int i;
  // first, allocate all the closest colors.  Could be optimized a lot!
  for (i = 0; i < n_cols; i++) {
    cols[i].red = ctbl[i].red * 256;
    cols[i].green = ctbl[i].green * 256;
    cols[i].blue = ctbl[i].blue * 256;
    draw->Allocate_Closest_Color(cols[i]);
  }

  // Next, set the pixels in the image correctly.
  unsigned short width, height;
  image_->Get_Size(width, height);
  unsigned char *gif_image = image_->Get_Data();

  int depth = draw->screen->depth;
  Visual *visual =
      DefaultVisual(draw->screen->display, draw->screen->screen_number);

  unsigned char *x_image;

  // assume that pixels are packed into even byte boundaries
  if (depth == 1) {
    static unsigned char byte_array[] = {0x80, 0x40, 0x20, 0x10,
                                         0x08, 0x04, 0x02, 0x01};
    // X uses free() so we must use malloc.  (so says sentinel)
    int byte_width = (width + 7) / 8;
    x_image = (unsigned char *)malloc(byte_width * height);
    int i, j;
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        if (cols[gif_image[i * width + j]].pixel)
          x_image[i * byte_width + (j / 8)] |= byte_array[j % 8];
        else
          x_image[i * byte_width + (j / 8)] &= ~byte_array[j % 8];
      }
    }
  } else if (depth <= 8) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height);
    for (i = 0; i < (width * height); i++)
      x_image[i] = (unsigned char)(cols[gif_image[i]].pixel);
  } else if (depth <= 16) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 2);
    unsigned short *x_image_16 = (unsigned short *)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_16[i] = (unsigned short)(cols[gif_image[i]].pixel);
  } else {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 4);
    uint32_t *x_image_32 = (uint32_t*)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_32[i] = (uint32_t)(cols[gif_image[i]].pixel);
  }

  XImage *image = XCreateImage(draw->screen->display, visual, depth, ZPixmap,
                               0 /* offset */, (char *)x_image, width, height,
                               8 /* bitmap_pad */,
                               0 /* (X will calculate) bytes per line */);

  Pixmap pix = XCreatePixmap(draw->screen->display, draw->xlib_drawable,
                             image->width, image->height, image->depth);
  draw->set_gc_using_fill(Am_No_Style, Am_DRAW_COPY);
  // Clear the clip region; restore it later.
  XSetClipMask(draw->screen->display, draw->screen->gc, None);
  XPutImage(draw->screen->display, pix, draw->screen->gc, image, 0, 0, 0, 0,
            image->width, image->height);
  ((Am_Drawonable_Impl *)draw)->Set_Clip(draw->screen->clip_region);

  XDestroyImage(image);

  return pix;
}